

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

char * __thiscall
sentencepiece::SentencePieceText_SentencePiece::_InternalParse
          (SentencePieceText_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32 uVar2;
  ParseContext *ptr_00;
  string *psVar3;
  ulong tag_01;
  SentencePieceText_SentencePiece *containing_type;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar4;
  SentencePieceText_SentencePiece *local_68;
  string *str_1;
  string *str;
  uint32 tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  SentencePieceText_SentencePiece *this_local;
  AllocatedData local_28;
  string *local_20;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_68 = (SentencePieceText_SentencePiece *)((long)&str + 4);
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  this_local = local_68;
  do {
    *(uint32 *)&(local_68->super_MessageLite)._vptr_MessageLite = 0;
    local_68 = (SentencePieceText_SentencePiece *)
               ((long)&(local_68->super_MessageLite)._vptr_MessageLite + 4);
  } while (local_68 != (SentencePieceText_SentencePiece *)&tag);
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(_tag,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_002b9a89;
    ptr_00 = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,(uint32 *)&str,0)
    ;
    tag_00 = (uint)str;
    if (ptr_00 == (ParseContext *)0x0) break;
    ctx_local = ptr_00;
    switch((uint)str >> 3) {
    case 1:
      if (((uint)str & 0xff) != 10) break;
      psVar3 = _internal_mutable_piece_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar3,(char *)ctx_local,_tag);
      goto joined_r0x002b98a1;
    case 2:
      if (((uint)str & 0xff) == 0x10) {
        _Internal::set_has_id((HasBits *)((long)&str + 4));
        uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
        this->id_ = uVar2;
        goto joined_r0x002b98a1;
      }
      break;
    case 3:
      if (((uint)str & 0xff) == 0x1a) {
        psVar3 = _internal_mutable_surface_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar3,(char *)ctx_local,_tag);
        goto joined_r0x002b98a1;
      }
      break;
    case 4:
      if (((uint)str & 0xff) == 0x20) {
        _Internal::set_has_begin((HasBits *)((long)&str + 4));
        uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
        this->begin_ = uVar2;
        goto joined_r0x002b98a1;
      }
      break;
    case 5:
      if (((uint)str & 0xff) == 0x28) {
        _Internal::set_has_end((HasBits *)((long)&str + 4));
        uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
        this->end_ = uVar2;
        goto joined_r0x002b98a1;
      }
    }
    if ((((uint)str & 7) == 4) || ((uint)str == 0)) {
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&_tag->super_EpsCopyInputStream,(uint)str);
      goto LAB_002b9a89;
    }
    if ((uint)str < 0x640) {
      local_28.flat = (KeyValue *)&(this->super_MessageLite)._internal_metadata_;
      local_18.ptr_ = (void *)local_28;
      local_10.ptr_ = (void *)local_28;
      if (((uint)((InternalMetadata *)local_28.flat)->ptr_ & 1) == 1) {
        pCVar4 = google::protobuf::internal::InternalMetadata::
                 PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                           ((InternalMetadata *)local_28.flat);
        local_20 = &pCVar4->unknown_fields;
      }
      else {
        local_20 = google::protobuf::internal::InternalMetadata::
                   mutable_unknown_fields_slow<std::__cxx11::string>
                             ((InternalMetadata *)local_28.flat);
      }
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,local_20,(char *)ctx_local,_tag);
    }
    else {
      tag_01 = (ulong)(uint)str;
      containing_type = internal_default_instance();
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ExtensionSet::ParseField
                            (&this->_extensions_,tag_01,(char *)ptr_00,
                             &containing_type->super_MessageLite,
                             &(this->super_MessageLite)._internal_metadata_,_tag);
    }
joined_r0x002b98a1:
  } while (ctx_local != (ParseContext *)0x0);
  ctx_local = (ParseContext *)0x0;
LAB_002b9a89:
  google::protobuf::internal::HasBits<1UL>::Or(&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
  return (char *)ctx_local;
}

Assistant:

const char* SentencePieceText_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string surface = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_surface();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 begin = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 end = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}